

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * Matrix4f::identity(void)

{
  float *pfVar1;
  Matrix4f *in_RDI;
  Matrix4f *m;
  
  Matrix4f(in_RDI,0.0);
  pfVar1 = operator()(in_RDI,0,0);
  *pfVar1 = 1.0;
  pfVar1 = operator()(in_RDI,1,1);
  *pfVar1 = 1.0;
  pfVar1 = operator()(in_RDI,2,2);
  *pfVar1 = 1.0;
  pfVar1 = operator()(in_RDI,3,3);
  *pfVar1 = 1.0;
  return in_RDI;
}

Assistant:

Matrix4f Matrix4f::identity()
{
	Matrix4f m;
	
	m( 0, 0 ) = 1;
	m( 1, 1 ) = 1;
	m( 2, 2 ) = 1;
	m( 3, 3 ) = 1;

	return m;
}